

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProductsStates
          (BeagleCPUImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  double dVar2;
  allocator_type *paVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  ulong __n;
  reference pvVar7;
  long in_RCX;
  long lVar8;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int j_1;
  int k_4;
  double patternWeight_1;
  int j;
  int k_3;
  int k_2;
  double denominator_1;
  int v_1;
  int patternIndex_1;
  double weight_1;
  double scale_1;
  int category_1;
  int k_1;
  double patternWeight;
  int k;
  double denominator;
  int v;
  int patternIndex;
  double weight;
  double scale;
  int category;
  int state;
  double patternDenominator;
  vector<double,_std::allocator<double>_> tmp;
  int pattern;
  allocator_type *in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  vector<double,_std::allocator<double>_> *this_00;
  int local_100;
  int local_fc;
  int local_ec;
  int local_e8;
  int local_e4;
  double local_e0;
  int local_c0;
  int local_bc;
  int local_ac;
  int local_88;
  double local_80;
  undefined1 local_61 [37];
  int local_3c;
  long local_38;
  double local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_38 = in_R9;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x14); local_3c = local_3c + 1) {
    __n = (ulong)(uint)(*(int *)(in_RDI + 0x24) * *(int *)(in_RDI + 0x24));
    local_61._1_8_ = 0;
    this_00 = (vector<double,_std::allocator<double>_> *)local_61;
    std::allocator<double>::allocator((allocator<double> *)0x1798f3);
    std::vector<double,_std::allocator<double>_>::vector
              (this_00,__n,(value_type *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::allocator<double>::~allocator((allocator<double> *)0x179921);
    local_80 = 0.0;
    iVar6 = *(int *)(local_10 + (long)local_3c * 4);
    if (iVar6 < *(int *)(in_RDI + 0x24)) {
      for (local_88 = 0; local_88 < *(int *)(in_RDI + 0x34); local_88 = local_88 + 1) {
        paVar3 = (allocator_type *)(*(double *)(local_20 + (long)local_88 * 8) * local_30);
        dVar1 = *(double *)(local_28 + (long)local_88 * 8);
        iVar5 = (local_88 * *(int *)(in_RDI + 0x14) + local_3c) * *(int *)(in_RDI + 0x2c);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)(local_18 + (long)(iVar5 + iVar6) * 8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar1;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_80;
        auVar12 = vfmadd213sd_fma(auVar9,auVar15,auVar21);
        local_80 = auVar12._0_8_;
        for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x24); local_ac = local_ac + 1) {
          in_stack_fffffffffffffee0 =
               (vector<double,_std::allocator<double>_> *)
               (*(double *)(local_18 + (long)(iVar5 + local_ac) * 8) * dVar1);
          in_stack_fffffffffffffed8 = paVar3;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_61 + 9),
                              (long)(local_ac * *(int *)(in_RDI + 0x24) + iVar6));
          auVar10._8_8_ = 0;
          auVar10._0_8_ = in_stack_fffffffffffffed8;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = in_stack_fffffffffffffee0;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *pvVar7;
          auVar12 = vfmadd213sd_fma(auVar10,auVar16,auVar22);
          *pvVar7 = auVar12._0_8_;
        }
      }
      auVar11._0_8_ = *(double *)(*(long *)(in_RDI + 0x80) + (long)local_3c * 8) / local_80;
      for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x24); local_bc = local_bc + 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_61 + 9),
                            (long)(local_bc * *(int *)(in_RDI + 0x24) + iVar6));
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *pvVar7;
        auVar11._8_8_ = 0;
        lVar8 = (long)(local_bc * *(int *)(in_RDI + 0x24) + iVar6);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(local_38 + lVar8 * 8);
        auVar12 = vfmadd213sd_fma(auVar11,auVar17,auVar23);
        *(long *)(local_38 + lVar8 * 8) = auVar12._0_8_;
      }
    }
    else {
      for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x34); local_c0 = local_c0 + 1) {
        dVar4 = *(double *)(local_20 + (long)local_c0 * 8) * local_30;
        dVar1 = *(double *)(local_28 + (long)local_c0 * 8);
        iVar6 = (local_c0 * *(int *)(in_RDI + 0x14) + local_3c) * *(int *)(in_RDI + 0x2c);
        local_e0 = 0.0;
        for (local_e4 = 0; local_e4 < *(int *)(in_RDI + 0x24); local_e4 = local_e4 + 1) {
          local_e0 = *(double *)(local_18 + (long)(iVar6 + local_e4) * 8) + local_e0;
        }
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_e0;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar1;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_80;
        auVar12 = vfmadd213sd_fma(auVar12,auVar18,auVar24);
        local_80 = auVar12._0_8_;
        for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0x24); local_e8 = local_e8 + 1) {
          for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x24); local_ec = local_ec + 1) {
            dVar2 = *(double *)(local_18 + (long)(iVar6 + local_e8) * 8);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_61 + 9),
                                (long)(local_e8 * *(int *)(in_RDI + 0x24) + local_ec));
            auVar13._8_8_ = 0;
            auVar13._0_8_ = dVar4;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = dVar2 * dVar1;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = *pvVar7;
            auVar12 = vfmadd213sd_fma(auVar13,auVar19,auVar25);
            *pvVar7 = auVar12._0_8_;
          }
        }
      }
      auVar14._0_8_ = *(double *)(*(long *)(in_RDI + 0x80) + (long)local_3c * 8) / local_80;
      for (local_fc = 0; local_fc < *(int *)(in_RDI + 0x24); local_fc = local_fc + 1) {
        for (local_100 = 0; local_100 < *(int *)(in_RDI + 0x24); local_100 = local_100 + 1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_61 + 9),
                              (long)(local_fc * *(int *)(in_RDI + 0x24) + local_100));
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *pvVar7;
          auVar14._8_8_ = 0;
          lVar8 = (long)(local_fc * *(int *)(in_RDI + 0x24) + local_100);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(local_38 + lVar8 * 8);
          auVar12 = vfmadd213sd_fma(auVar14,auVar20,auVar26);
          *(long *)(local_38 + lVar8 * 8) = auVar12._0_8_;
        }
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    tmp[k * kStateCount + state] += preOrderPartial[v + k] * weight * scale;
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                outCrossProducts[k * kStateCount + state] += tmp[k * kStateCount + state] * patternWeight;
            }

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < kStateCount; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    for (int j = 0; j < kStateCount; j++) {
                        tmp[k * kStateCount + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
                }
            }
        }
    }
}